

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O2

void anon_unknown.dwarf_21986b::validatePixels
               (int *pImageHeight,int *pImageWidth,Array2D<Imath_3_2::half> *pPixels,int pNbChannels
               ,bool pIsLeft)

{
  Array2D<Imath_3_2::half> *pAVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  half rgbaValue [4];
  long local_60;
  half local_58;
  half local_56;
  half local_54;
  Array2D<Imath_3_2::half> *local_50;
  int *local_48;
  size_t local_40;
  int *local_38;
  
  local_40 = (ulong)(uint)pNbChannels * 2;
  local_60 = 0;
  lVar6 = 0;
  local_50 = pPixels;
  local_48 = pImageHeight;
  local_38 = pImageWidth;
  do {
    if (*local_48 <= lVar6) {
      return;
    }
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < *local_38; lVar4 = lVar4 + 1) {
      generatePixel((int)lVar6,(int)lVar4,&local_58,pIsLeft);
      iVar2 = bcmp((void *)((long)&local_50->_data->_h + lVar5 + local_50->_sizeY * local_60),
                   &local_58,local_40);
      if (iVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"ERROR at pixel [");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar6);
        poVar3 = std::operator<<(poVar3,";");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar4);
        poVar3 = std::operator<<(poVar3,"]");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"\tExpected [");
        poVar3 = (ostream *)::operator<<(poVar3,local_58);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = (ostream *)::operator<<(poVar3,local_56);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = (ostream *)::operator<<(poVar3,local_54);
        poVar3 = std::operator<<(poVar3,"] ");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"\tReceived [");
        pAVar1 = local_50;
        poVar3 = (ostream *)
                 ::operator<<(poVar3,(half)*(uint16_t *)
                                            ((long)&local_50->_data->_h +
                                            lVar5 + local_50->_sizeY * local_60));
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = (ostream *)
                 ::operator<<(poVar3,(half)*(uint16_t *)
                                            ((long)&pAVar1->_data[1]._h +
                                            pAVar1->_sizeY * local_60 + lVar5));
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = (ostream *)
                 ::operator<<(poVar3,(half)*(uint16_t *)
                                            ((long)&pAVar1->_data[2]._h +
                                            local_60 * pAVar1->_sizeY + lVar5));
        poVar3 = std::operator<<(poVar3,"]");
        std::endl<char,std::char_traits<char>>(poVar3);
        __assert_fail("retVal == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimized.cpp"
                      ,0xb8,
                      "void (anonymous namespace)::validatePixels(const int &, const int &, Array2D<half> &, int, bool)"
                     );
      }
      lVar5 = lVar5 + (long)pNbChannels * 2;
    }
    lVar6 = lVar6 + 1;
    local_60 = local_60 + 2;
  } while( true );
}

Assistant:

void
validatePixels (
    const int&     pImageHeight,
    const int&     pImageWidth,
    Array2D<half>& pPixels,
    int            pNbChannels,
    bool           pIsLeft)
{
    for (int i = 0; i < pImageHeight; ++i)
    {
        for (int j = 0; j < pImageWidth; ++j)
        {
            int  retVal = -1;
            half rgbaValue[4];
            generatePixel (i, j, &rgbaValue[0], pIsLeft);

            retVal = memcmp (
                (void*) &pPixels[i][j * pNbChannels],
                (void*) &rgbaValue[0],
                pNbChannels * sizeof (half));

            if (retVal != 0)
            {
                cout << "ERROR at pixel [" << i << ";" << j << "]" << endl;
                cout << "\tExpected [" << rgbaValue[0] << ", " << rgbaValue[1]
                     << ", " << rgbaValue[2] << "] " << endl;

                cout << "\tReceived [" << pPixels[i][j * pNbChannels] << ", "
                     << pPixels[i][j * pNbChannels + 1] << ", "
                     << pPixels[i][j * pNbChannels + 2] << "]" << endl;
                assert (retVal == 0);
            }
        }
    }
}